

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong __thiscall mkvparser::EBMLHeader::Parse(EBMLHeader *this,IMkvReader *pReader,longlong *pos)

{
  int iVar1;
  longlong lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uchar scan_byte;
  long len;
  longlong available;
  longlong total;
  longlong size;
  longlong id;
  char local_61;
  long local_60;
  long local_58;
  char **local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (pReader != (IMkvReader *)0x0) {
    iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_48,&local_58);
    if (iVar1 < 0) {
LAB_0010ab58:
      return (long)iVar1;
    }
    *pos = 0;
    lVar5 = 0x400;
    if (local_58 < 0x400) {
      lVar5 = local_58;
    }
    local_61 = '\0';
    lVar4 = 0;
    if (0 < local_58) {
      do {
        iVar1 = (**pReader->_vptr_IMkvReader)(pReader,lVar4,1,&local_61);
        if (iVar1 < 0) goto LAB_0010ab58;
        if (iVar1 != 0) {
          return -3;
        }
        lVar4 = *pos;
        if (local_61 == '\x1a') break;
        lVar4 = lVar4 + 1;
        *pos = lVar4;
      } while (lVar4 < lVar5);
    }
    local_60 = 0;
    lVar2 = ReadID(pReader,lVar4,&local_60);
    if (lVar2 == -3) {
      return -3;
    }
    if ((lVar2 == 0x1a45dfa3) && (local_60 == 4)) {
      lVar5 = *pos;
      *pos = lVar5 + 4;
      lVar2 = GetUIntLength(pReader,lVar5 + 4,&local_60);
      if (-1 < lVar2) {
        if (lVar2 != 0) {
          return -3;
        }
        if ((0xfffffffffffffff7 < local_60 - 9U) &&
           (lVar5 = *pos, local_48 < 0 || local_60 <= local_48 - lVar5)) {
          if (local_58 - lVar5 < local_60) {
            return lVar5 + local_60;
          }
          lVar2 = ReadUInt(pReader,lVar5,&local_60);
          if (lVar2 < 0) {
            return lVar2;
          }
          lVar5 = *pos + local_60;
          *pos = lVar5;
          if (local_48 < 0 || lVar2 <= local_48 - lVar5) {
            lVar4 = lVar5 + lVar2;
            if (local_58 - lVar5 < lVar2) {
              return lVar4;
            }
            Init(this);
            lVar5 = *pos;
            if (lVar5 < lVar4) {
              local_50 = &this->m_docType;
              do {
                lVar3 = ParseElementHeader(pReader,pos,lVar4,&local_38,&local_40);
                lVar5 = local_40;
                if (lVar3 < 0) {
                  return lVar3;
                }
                if (local_40 == 0) {
                  return -2;
                }
                if (0x42f1 < local_38) {
                  if (local_38 == 0x42f2) {
                    lVar3 = UnserializeUInt(pReader,*pos,local_40);
                    this->m_maxIdLength = lVar3;
                  }
                  else if (local_38 == 0x42f3) {
                    lVar3 = UnserializeUInt(pReader,*pos,local_40);
                    this->m_maxSizeLength = lVar3;
                  }
                  else {
                    if (local_38 != 0x42f7) goto switchD_0010ac52_caseD_4283;
                    lVar3 = UnserializeUInt(pReader,*pos,local_40);
                    this->m_readVersion = lVar3;
                  }
                  goto LAB_0010ad11;
                }
                switch(local_38) {
                case 0x4282:
                  if (*local_50 != (char *)0x0) {
                    return -2;
                  }
                  lVar3 = UnserializeString(pReader,*pos,local_40,local_50);
                  if (lVar3 != 0) {
                    return lVar3;
                  }
                default:
                  goto switchD_0010ac52_caseD_4283;
                case 0x4285:
                  lVar3 = UnserializeUInt(pReader,*pos,local_40);
                  this->m_docTypeReadVersion = lVar3;
                  break;
                case 0x4286:
                  lVar3 = UnserializeUInt(pReader,*pos,local_40);
                  this->m_version = lVar3;
                  break;
                case 0x4287:
                  lVar3 = UnserializeUInt(pReader,*pos,local_40);
                  this->m_docTypeVersion = lVar3;
                }
LAB_0010ad11:
                if (lVar3 < 1) {
                  return -2;
                }
switchD_0010ac52_caseD_4283:
                lVar5 = lVar5 + *pos;
                *pos = lVar5;
              } while (lVar5 < lVar4);
            }
            if ((((lVar5 == lVar4) && (this->m_docType != (char *)0x0)) &&
                (0 < this->m_docTypeReadVersion)) && (0 < this->m_docTypeVersion)) {
              if (this->m_maxIdLength - 5U < 0xfffffffffffffffc) {
                return -2;
              }
              return (ulong)(0xfffffffffffffff7 < this->m_maxSizeLength - 9U) * 2 + -2;
            }
          }
        }
      }
    }
  }
  return -2;
}

Assistant:

long long EBMLHeader::Parse(IMkvReader* pReader, long long& pos) {
  if (!pReader)
    return E_FILE_FORMAT_INVALID;

  long long total, available;

  long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  pos = 0;

  // Scan until we find what looks like the first byte of the EBML header.
  const long long kMaxScanBytes = (available >= 1024) ? 1024 : available;
  const unsigned char kEbmlByte0 = 0x1A;
  unsigned char scan_byte = 0;

  while (pos < kMaxScanBytes) {
    status = pReader->Read(pos, 1, &scan_byte);

    if (status < 0)  // error
      return status;
    else if (status > 0)
      return E_BUFFER_NOT_FULL;

    if (scan_byte == kEbmlByte0)
      break;

    ++pos;
  }

  long len = 0;
  const long long ebml_id = ReadID(pReader, pos, len);

  if (ebml_id == E_BUFFER_NOT_FULL)
    return E_BUFFER_NOT_FULL;

  if (len != 4 || ebml_id != libwebm::kMkvEBML)
    return E_FILE_FORMAT_INVALID;

  // Move read pos forward to the EBML header size field.
  pos += 4;

  // Read length of size field.
  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return E_FILE_FORMAT_INVALID;
  else if (result > 0)  // need more data
    return E_BUFFER_NOT_FULL;

  if (len < 1 || len > 8)
    return E_FILE_FORMAT_INVALID;

  if ((total >= 0) && ((total - pos) < len))
    return E_FILE_FORMAT_INVALID;

  if ((available - pos) < len)
    return pos + len;  // try again later

  // Read the EBML header size.
  result = ReadUInt(pReader, pos, len);

  if (result < 0)  // error
    return result;

  pos += len;  // consume size field

  // pos now designates start of payload

  if ((total >= 0) && ((total - pos) < result))
    return E_FILE_FORMAT_INVALID;

  if ((available - pos) < result)
    return pos + result;

  const long long end = pos + result;

  Init();

  while (pos < end) {
    long long id, size;

    status = ParseElementHeader(pReader, pos, end, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvEBMLVersion) {
      m_version = UnserializeUInt(pReader, pos, size);

      if (m_version <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLReadVersion) {
      m_readVersion = UnserializeUInt(pReader, pos, size);

      if (m_readVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLMaxIDLength) {
      m_maxIdLength = UnserializeUInt(pReader, pos, size);

      if (m_maxIdLength <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLMaxSizeLength) {
      m_maxSizeLength = UnserializeUInt(pReader, pos, size);

      if (m_maxSizeLength <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDocType) {
      if (m_docType)
        return E_FILE_FORMAT_INVALID;

      status = UnserializeString(pReader, pos, size, m_docType);

      if (status)  // error
        return status;
    } else if (id == libwebm::kMkvDocTypeVersion) {
      m_docTypeVersion = UnserializeUInt(pReader, pos, size);

      if (m_docTypeVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDocTypeReadVersion) {
      m_docTypeReadVersion = UnserializeUInt(pReader, pos, size);

      if (m_docTypeReadVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;
  }

  if (pos != end)
    return E_FILE_FORMAT_INVALID;

  // Make sure DocType, DocTypeReadVersion, and DocTypeVersion are valid.
  if (m_docType == NULL || m_docTypeReadVersion <= 0 || m_docTypeVersion <= 0)
    return E_FILE_FORMAT_INVALID;

  // Make sure EBMLMaxIDLength and EBMLMaxSizeLength are valid.
  if (m_maxIdLength <= 0 || m_maxIdLength > 4 || m_maxSizeLength <= 0 ||
      m_maxSizeLength > 8)
    return E_FILE_FORMAT_INVALID;

  return 0;
}